

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::setFixedSize(QWidget *this,int w,int h)

{
  bool bVar1;
  QWidgetPrivate *this_00;
  int in_EDX;
  int in_ESI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  int *unaff_retaddr;
  undefined7 in_stack_00000008;
  bool in_stack_0000000f;
  bool maxSizeSet;
  QWidgetPrivate *in_stack_00000010;
  bool minSizeSet;
  QWidgetPrivate *d;
  int in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint uVar2;
  int w_00;
  QWidgetPrivate *this_01;
  
  this_01 = *(QWidgetPrivate **)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QWidget *)0x36b752);
  bVar1 = QWidgetPrivate::setMinimumSize_helper
                    ((QWidgetPrivate *)this,(int *)d,(int *)in_stack_00000010);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffdc);
  bVar1 = QWidgetPrivate::setMaximumSize_helper
                    (in_stack_00000010,(int *)CONCAT17(in_stack_0000000f,in_stack_00000008),
                     unaff_retaddr);
  w_00 = CONCAT13((char)(uVar2 >> 0x18),CONCAT12(bVar1,(short)uVar2));
  if (((uVar2 & 0x1000000) != 0) || (bVar1)) {
    bVar1 = isWindow(in_RDI);
    if (bVar1) {
      QWidgetPrivate::setConstraints_sys(this_01);
    }
    else {
      QWidgetPrivate::updateGeometry_helper(in_stack_00000010,in_stack_0000000f);
    }
    if ((in_ESI != 0xffffff) || (in_EDX != 0xffffff)) {
      resize((QWidget *)this_00,w_00,in_stack_ffffffffffffffd8);
    }
  }
  if (*(QWidgetPrivate **)(in_FS_OFFSET + 0x28) != this_01) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::setFixedSize(int w, int h)
{
    Q_D(QWidget);
    bool minSizeSet = d->setMinimumSize_helper(w, h);
    bool maxSizeSet = d->setMaximumSize_helper(w, h);
    if (!minSizeSet && !maxSizeSet)
        return;

    if (isWindow())
        d->setConstraints_sys();
    else
        d->updateGeometry_helper(true);

    if (w != QWIDGETSIZE_MAX || h != QWIDGETSIZE_MAX)
        resize(w, h);
}